

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  undefined4 *puVar1;
  Recycler *pRVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  code *pcVar4;
  bool bVar5;
  undefined8 *in_FS_OFFSET;
  CollectionState local_1c;
  
  if (this->m_recycler->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1b,"(!m_recycler.isHeapEnumInProgress)",
                       "!m_recycler.isHeapEnumInProgress");
    if (!bVar5) goto LAB_002750db;
    *puVar1 = 0;
  }
  if (this->m_recycler->allowAllocationDuringHeapEnum == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1c,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar5) {
LAB_002750db:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar1 = 0;
  }
  EnsureNotCollecting(this->m_recycler);
  DoCommonSetup(this);
  Recycler::ResetMarks(this->m_recycler,ResetMarkFlags_HeapEnumeration);
  pRVar2 = this->m_recycler;
  local_1c = CollectionStateNotCollecting;
  pOVar3 = (pRVar2->collectionState).observer;
  if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((pRVar2->collectionState).value != CollectionStateNotCollecting)) {
    (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_1c,&pRVar2->collectionState);
  }
  (pRVar2->collectionState).value = local_1c;
  pRVar2 = this->m_recycler;
  pRVar2->isHeapEnumInProgress = true;
  pRVar2->isCollectionDisabled = true;
  return;
}

Assistant:

void Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration()
{
    Assert(!m_recycler.isHeapEnumInProgress);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
    m_recycler.EnsureNotCollecting();
    DoCommonSetup();
    m_recycler.ResetMarks(ResetMarkFlags_HeapEnumeration);
    m_recycler.SetCollectionState(CollectionStateNotCollecting);
    m_recycler.isHeapEnumInProgress = true;
    m_recycler.isCollectionDisabled = true;
}